

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O0

string * __thiscall duckdb::string_t::GetString_abi_cxx11_(string_t *this)

{
  char *pcVar1;
  idx_t iVar2;
  string_t *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  pcVar1 = GetData(in_RSI);
  iVar2 = GetSize(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,iVar2,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

string GetString() const {
		return string(GetData(), GetSize());
	}